

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTessellation.cpp
# Opt level: O0

void __thiscall
glcts::TessellationShaderTessellationgl_TessCoord::TessellationShaderTessellationgl_TessCoord
          (TessellationShaderTessellationgl_TessCoord *this,Context *context,
          ExtParameters *extParams,_tessellation_test_type test_type)

{
  char *name;
  string local_48;
  _tessellation_test_type local_24;
  ExtParameters *pEStack_20;
  _tessellation_test_type test_type_local;
  ExtParameters *extParams_local;
  Context *context_local;
  TessellationShaderTessellationgl_TessCoord *this_local;
  
  local_24 = test_type;
  pEStack_20 = extParams;
  extParams_local = (ExtParameters *)context;
  context_local = (Context *)this;
  getTypeName_abi_cxx11_
            (&local_48,(TessellationShaderTessellationgl_TessCoord *)(ulong)test_type,
             (_tessellation_test_type)extParams);
  name = (char *)std::__cxx11::string::c_str();
  TestCaseBase::TestCaseBase
            (&this->super_TestCaseBase,context,extParams,name,
             "Verifies that u, v, w components of gl_TessCoord are within range for a variety of input/outer tessellation level combinations for all primitive modes. Verifies each component is within valid  range. Also checks that w is always equal to 0 for isolines mode."
            );
  std::__cxx11::string::~string((string *)&local_48);
  (this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TessellationShaderTessellationgl_TessCoord_03272a68;
  this->m_test_type = local_24;
  this->m_bo_id = 0;
  this->m_broken_ts_id = 0;
  this->m_fs_id = 0;
  this->m_vs_id = 0;
  this->m_vao_id = 0;
  std::
  vector<glcts::TessellationShaderTessellationgl_TessCoord::_test_descriptor,_std::allocator<glcts::TessellationShaderTessellationgl_TessCoord::_test_descriptor>_>
  ::vector(&this->m_tests);
  this->m_utils_ptr = (TessellationShaderUtils *)0x0;
  return;
}

Assistant:

TessellationShaderTessellationgl_TessCoord::TessellationShaderTessellationgl_TessCoord(
	Context& context, const ExtParameters& extParams, _tessellation_test_type test_type)
	: TestCaseBase(context, extParams, getTypeName(test_type).c_str(),
				   "Verifies that u, v, w components of gl_TessCoord are within "
				   "range for a variety of input/outer tessellation level combinations "
				   "for all primitive modes. Verifies each component is within valid "
				   " range. Also checks that w is always equal to 0 for isolines mode.")
	, m_test_type(test_type)
	, m_bo_id(0)
	, m_broken_ts_id(0)
	, m_fs_id(0)
	, m_vs_id(0)
	, m_vao_id(0)
	, m_utils_ptr(0)
{
	/* Left blank on purpose */
}